

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O3

TypedArrayBase *
Js::TypedArrayBase::ValidateTypedArray(Var aValue,ScriptContext *scriptContext,LPCWSTR apiName)

{
  bool bVar1;
  TypedArrayBase *pTVar2;
  
  bVar1 = VarIs<Js::TypedArrayBase>(aValue);
  if (bVar1) {
    pTVar2 = UnsafeVarTo<Js::TypedArrayBase>(aValue);
    if (pTVar2 != (TypedArrayBase *)0x0) {
      if (((pTVar2->super_ArrayBufferParent).arrayBuffer.ptr)->isDetached != true) {
        return pTVar2;
      }
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ebe5,apiName);
    }
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec25,(PCWSTR)0x0);
}

Assistant:

TypedArrayBase* TypedArrayBase::ValidateTypedArray(Var aValue, ScriptContext *scriptContext, LPCWSTR apiName)
    {
        TypedArrayBase *typedArrayBase = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(aValue);
        if (!typedArrayBase)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedTypedArray);
        }

        if (typedArrayBase->IsDetachedBuffer())
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_DetachedTypedArray, apiName);
        }

        return typedArrayBase;
    }